

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DDictHashSet_expand(ZSTD_DDictHashSet *hashSet,ZSTD_customMem customMem)

{
  ZSTD_DDict **ptr;
  ulong uVar1;
  uint uVar2;
  ZSTD_DDict **ppZVar3;
  size_t sVar4;
  size_t err_code;
  size_t i;
  size_t oldTableSize;
  ZSTD_DDict **oldTable;
  ZSTD_DDict **newTable;
  size_t newTableSize;
  ZSTD_DDictHashSet *hashSet_local;
  
  sVar4 = hashSet->ddictPtrTableSize;
  ppZVar3 = (ZSTD_DDict **)ZSTD_customCalloc(sVar4 << 4,customMem);
  ptr = hashSet->ddictPtrTable;
  uVar1 = hashSet->ddictPtrTableSize;
  if (ppZVar3 == (ZSTD_DDict **)0x0) {
    hashSet_local = (ZSTD_DDictHashSet *)0xffffffffffffffc0;
  }
  else {
    hashSet->ddictPtrTable = ppZVar3;
    hashSet->ddictPtrTableSize = sVar4 << 1;
    hashSet->ddictPtrCount = 0;
    for (err_code = 0; err_code < uVar1; err_code = err_code + 1) {
      if (ptr[err_code] != (ZSTD_DDict *)0x0) {
        sVar4 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ptr[err_code]);
        uVar2 = ERR_isError(sVar4);
        if (uVar2 != 0) {
          return sVar4;
        }
      }
    }
    ZSTD_customFree(ptr,customMem);
    hashSet_local = (ZSTD_DDictHashSet *)0x0;
  }
  return (size_t)hashSet_local;
}

Assistant:

static size_t ZSTD_DDictHashSet_expand(ZSTD_DDictHashSet* hashSet, ZSTD_customMem customMem) {
    size_t newTableSize = hashSet->ddictPtrTableSize * DDICT_HASHSET_RESIZE_FACTOR;
    const ZSTD_DDict** newTable = (const ZSTD_DDict**)ZSTD_customCalloc(sizeof(ZSTD_DDict*) * newTableSize, customMem);
    const ZSTD_DDict** oldTable = hashSet->ddictPtrTable;
    size_t oldTableSize = hashSet->ddictPtrTableSize;
    size_t i;

    DEBUGLOG(4, "Expanding DDict hash table! Old size: %zu new size: %zu", oldTableSize, newTableSize);
    RETURN_ERROR_IF(!newTable, memory_allocation, "Expanded hashset allocation failed!");
    hashSet->ddictPtrTable = newTable;
    hashSet->ddictPtrTableSize = newTableSize;
    hashSet->ddictPtrCount = 0;
    for (i = 0; i < oldTableSize; ++i) {
        if (oldTable[i] != NULL) {
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_emplaceDDict(hashSet, oldTable[i]), "");
        }
    }
    ZSTD_customFree((void*)oldTable, customMem);
    DEBUGLOG(4, "Finished re-hash");
    return 0;
}